

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_parse.c
# Opt level: O0

void ParseCarrier(COM0R20_CB_t *cbp)

{
  byte bVar1;
  char *local_f0;
  byte local_e1;
  uint local_e0;
  uint8_t map;
  int i_6;
  uint8_t gen;
  int i_5;
  int iStack_cc;
  uint8_t ddi_desc;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int count;
  char *ddi_port_str [4];
  char *misc_io2_str [8];
  char *misc_io1_str [8];
  COM0R20_CB_t *cbp_local;
  
  memcpy(misc_io2_str + 7,&PTR_anon_var_dwarf_42_00108a40,0x40);
  memcpy(ddi_port_str + 3,&PTR_anon_var_dwarf_c2_00108a80,0x40);
  _i = "eDisplay Port";
  ddi_port_str[0] = "Display Port";
  ddi_port_str[1] = "HDMI/DVI";
  ddi_port_str[2] = "SDVO";
  printf("Carrier board EEPROM\n");
  printf("   ");
  PrintUdid(&cbp->DevId);
  printf("\n");
  printf("   Carrier Type: %d\n",(ulong)cbp->CBType);
  printf("   Spec Revision: %d.%d\n",(ulong)(uint)((int)(uint)cbp->SpecRev >> 4),
         (ulong)(cbp->SpecRev & 0xf));
  printf("   USB Port Count: Super Speed: %d, High Speed: %d\n",
         (ulong)((int)(uint)cbp->UsbDesc >> 4 & 7),(ulong)(cbp->UsbDesc & 0xf));
  printf("   SAS ports: ");
  for (i_2 = 0; i_2 < 4; i_2 = i_2 + 1) {
    if (((int)(uint)cbp->SasDesc >> ((byte)(i_2 << 1) & 0x1f) & 1U) == 0) {
      local_f0 = "None";
    }
    else {
      local_f0 = "SATA";
      if (((int)(uint)cbp->SasDesc >> ((char)(i_2 << 1) + 1U & 0x1f) & 1U) != 0) {
        local_f0 = "SAS";
      }
    }
    printf("%d:%s ",(ulong)(i_2 + 1),local_f0);
  }
  printf("\n");
  printf("   LAN: ");
  for (i_3 = 0; i_3 < 3; i_3 = i_3 + 1) {
    if (((uint)cbp->LanDesc & 1 << ((byte)i_3 & 0x1f)) != 0) {
      printf("GBE%d ",(ulong)(uint)i_3);
    }
  }
  printf("\n");
  printf("   Misc IO1: ");
  for (i_4 = 0; i_4 < 8; i_4 = i_4 + 1) {
    if (((uint)cbp->MiscIo1 & 1 << ((byte)i_4 & 0x1f)) != 0) {
      printf("%s ",misc_io2_str[(long)i_4 + 7]);
    }
  }
  printf("\n");
  printf("   Misc IO2: ");
  for (iStack_cc = 0; iStack_cc < 8; iStack_cc = iStack_cc + 1) {
    if (((uint)cbp->MiscIo2 & 1 << ((byte)iStack_cc & 0x1f)) != 0) {
      printf("%s ",ddi_port_str[(long)iStack_cc + 3]);
    }
  }
  printf("\n");
  printf("   DDI: ");
  for (i_5 = 0; i_5 < 4; i_5 = i_5 + 1) {
    gen = cbp->DDIDesc[i_5 >> 1];
    if ((i_5 & 1U) != 0) {
      gen = (uint8_t)((int)(uint)gen >> 4);
    }
    bVar1 = gen & 7;
    if ((bVar1 != 0) && (bVar1 < 5)) {
      printf("%d:%s ",(ulong)(uint)i_5,*(undefined8 *)(&i + (long)(int)(bVar1 - 1) * 2));
    }
  }
  printf("\n");
  printf("   PCI Express Lane Gen:");
  i_1 = 0;
  for (i_6 = 0; i_6 < 0x20; i_6 = i_6 + 1) {
    bVar1 = (byte)((int)(uint)cbp->PCIeGen[i_6 >> 2] >> (sbyte)((i_6 & 3U) << 1)) & 3;
    if (bVar1 != 3) {
      if (i_1 % 0x10 == 0) {
        printf("\n      ");
      }
      printf("%d:Gen%d ",(ulong)(uint)i_6,(ulong)(bVar1 + 1));
      i_1 = i_1 + 1;
    }
  }
  printf("\n");
  printf("   PCI Express Lane Map:");
  i_1 = 0;
  for (local_e0 = 0; (int)local_e0 < 0x20; local_e0 = local_e0 + 1) {
    local_e1 = cbp->LaneMap[(int)local_e0 >> 1];
    if ((local_e0 & 1) != 0) {
      local_e1 = (byte)((int)(uint)local_e1 >> 4);
    }
    local_e1 = local_e1 & 7;
    if ((local_e1 != 0) && (local_e1 != 7)) {
      if (i_1 % 0x10 == 0) {
        printf("\n      ");
      }
      printf("%d:x%d ",(ulong)local_e0,(ulong)(uint)(1 << (local_e1 - 1 & 0x1f)));
      i_1 = i_1 + 1;
    }
  }
  printf("\n");
  return;
}

Assistant:

void ParseCarrier(COM0R20_CB_t *cbp)
{
	const char *misc_io1_str[] = 
		{ "WAKE0", "WAKE1", "SUS", "BATLOW", "THRMP", "EBROM", "WDT", "AC97" };
 	const char *misc_io2_str[] = 
		{ "SSC", "SDIO", "LID_SW", "Sleep", "FAN0", "SER0", "SER1", "Reserved" };
	const char *ddi_port_str[] =
		{ "eDisplay Port", "Display Port", "HDMI/DVI", "SDVO" };
	int count;
    printf("Carrier board EEPROM\n");
    printf("   "); PrintUdid(&cbp->DevId); printf("\n");
    printf("   Carrier Type: %d\n", cbp->CBType);
    printf("   Spec Revision: %d.%d\n", cbp->SpecRev >> 4 & 0xF, cbp->SpecRev & 0xF);
    printf("   USB Port Count: Super Speed: %d, High Speed: %d\n",
		cbp->UsbDesc >> 4 & 7, cbp->UsbDesc & 0xF);
	printf("   SAS ports: ");
	for(int i = 0; i < 4; i++) {
		printf("%d:%s ", i + 1, 
			(cbp->SasDesc >> (i * 2) & 1) ?
				((cbp->SasDesc >> (i * 2 + 1) & 1) ? "SAS" : "SATA") : "None"); 
	}
	printf("\n");
	printf("   LAN: ");
	for(int i = 0; i < 3; i++) {
		if(cbp->LanDesc & (1 << i)) {
			printf("GBE%d ", i);
		}
	}
	printf("\n");
	printf("   Misc IO1: ");
	for(int i = 0; i < 8; i++) {
		if(cbp->MiscIo1 & (1 << i)) {
			printf("%s ", misc_io1_str[i]);
		}
	}
	printf("\n");
	printf("   Misc IO2: ");
	for(int i = 0; i < 8; i++) {
		if(cbp->MiscIo2 & (1 << i)) {
			printf("%s ", misc_io2_str[i]);
		}
	}
	printf("\n");
	printf("   DDI: ");
	for(int i = 0; i < 4; i++) {
		uint8_t ddi_desc = cbp->DDIDesc[i >> 1];
		if(i & 1)
			ddi_desc >>= 4;
		ddi_desc &= 7;
		if(ddi_desc >= 1 && ddi_desc <= 4) {
			printf("%d:%s ", i, ddi_port_str[ddi_desc - 1]);
		}
	}
	printf("\n");
	printf("   PCI Express Lane Gen:");
	count = 0;
	for(int i = 0; i < 32; i++) {
		uint8_t gen = cbp->PCIeGen[i >> 2];
		gen >>= (i & 3) << 1;
		gen &= 3;
		if(gen != 3) {
			if(count % 16 == 0) {
				printf("\n      ");
			}
			printf("%d:Gen%d ", i, gen + 1);
			count ++;
		}
	}
	printf("\n");
	printf("   PCI Express Lane Map:");
	count = 0;
	for(int i = 0; i < 32; i++) {
		uint8_t map = cbp->LaneMap[i >> 1];
		if(i & 1)
			map >>= 4;
		map &= 7;
		if(map != 0 && map != 7) {
			if(count % 16 == 0) {
				printf("\n      ");
			}
			printf("%d:x%d ", i, 1 << (map-1));
			count ++;
		}
	}
	printf("\n");
}